

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O0

void __thiscall
DListBase<ExpirableObject_*,_RealCount>::Clear<Memory::ArenaAllocator>
          (DListBase<ExpirableObject_*,_RealCount> *this,ArenaAllocator *allocator)

{
  DListNodeBase<ExpirableObject_*> *pDVar1;
  bool bVar2;
  DListNodeBase<ExpirableObject_*> **ppDVar3;
  NodeBase *next;
  NodeBase *current;
  ArenaAllocator *allocator_local;
  DListBase<ExpirableObject_*,_RealCount> *this_local;
  
  ppDVar3 = DListNodeBase<ExpirableObject_*>::Next(&this->super_DListNodeBase<ExpirableObject_*>);
  next = *ppDVar3;
  while( true ) {
    bVar2 = IsHead(this,next);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    ppDVar3 = DListNodeBase<ExpirableObject_*>::Next(next);
    pDVar1 = *ppDVar3;
    Memory::
    DeleteObject<Memory::ArenaAllocator,(Memory::AllocatorDeleteFlags)0,DListNode<ExpirableObject*>>
              (allocator,(DListNode<ExpirableObject_*> *)next);
    next = pDVar1;
  }
  ppDVar3 = DListNodeBase<ExpirableObject_*>::Next(&this->super_DListNodeBase<ExpirableObject_*>);
  *ppDVar3 = &this->super_DListNodeBase<ExpirableObject_*>;
  ppDVar3 = DListNodeBase<ExpirableObject_*>::Prev(&this->super_DListNodeBase<ExpirableObject_*>);
  *ppDVar3 = &this->super_DListNodeBase<ExpirableObject_*>;
  RealCount::SetCount(&this->super_RealCount,0);
  return;
}

Assistant:

void Clear(TAllocator * allocator)
    {
        NodeBase * current = this->Next();
        while (!this->IsHead(current))
        {
            NodeBase * next = current->Next();
            AllocatorDelete(TAllocator, allocator, (Node *)current);
            current = next;
        }

        this->Next() = this;
        this->Prev() = this;
        this->SetCount(0);
    }